

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<2>::operator()
          (_defaultInitializer<2> *this,float *param_1,char *param_2)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Constructing BlenderDNA Structure encountered an error","");
  ::std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_008bf448;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void operator ()(T& /*out*/,const char* = "") {
        // obviously, it is crucial that _DefaultInitializer is used
        // only from within a catch clause.
        throw DeadlyImportError("Constructing BlenderDNA Structure encountered an error");
    }